

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O2

int mbedtls_hmac_drbg_reseed(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t len)

{
  int iVar1;
  size_t sVar2;
  uchar seed [384];
  
  iVar1 = -5;
  if (len < 0x101) {
    sVar2 = ctx->entropy_len;
    if (sVar2 + len < 0x181) {
      memset(seed,0,0x180);
      iVar1 = (*ctx->f_entropy)(ctx->p_entropy,seed,sVar2);
      if (iVar1 == 0) {
        sVar2 = ctx->entropy_len;
        if (len != 0 && additional != (uchar *)0x0) {
          memcpy(seed + sVar2,additional,len);
          sVar2 = sVar2 + len;
        }
        mbedtls_hmac_drbg_update(ctx,seed,sVar2);
        ctx->reseed_counter = 1;
        iVar1 = 0;
      }
      else {
        iVar1 = -9;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_hmac_drbg_reseed( mbedtls_hmac_drbg_context *ctx,
                      const unsigned char *additional, size_t len )
{
    unsigned char seed[MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT];
    size_t seedlen;

    /* III. Check input length */
    if( len > MBEDTLS_HMAC_DRBG_MAX_INPUT ||
        ctx->entropy_len + len > MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT )
    {
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );
    }

    memset( seed, 0, MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT );

    /* IV. Gather entropy_len bytes of entropy for the seed */
    if( ctx->f_entropy( ctx->p_entropy, seed, ctx->entropy_len ) != 0 )
        return( MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED );

    seedlen = ctx->entropy_len;

    /* 1. Concatenate entropy and additional data if any */
    if( additional != NULL && len != 0 )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /* 2. Update state */
    mbedtls_hmac_drbg_update( ctx, seed, seedlen );

    /* 3. Reset reseed_counter */
    ctx->reseed_counter = 1;

    /* 4. Done */
    return( 0 );
}